

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export_strings.cpp
# Opt level: O1

uint64_t __thiscall
pstore::exchange::export_ns::string_mapping::add(string_mapping *this,address addr)

{
  mapped_type mVar1;
  __node_base_ptr p_Var2;
  mapped_type *pmVar3;
  key_type local_18;
  
  local_18.a_ = addr.a_;
  p_Var2 = std::
           _Hashtable<pstore::address,_std::pair<const_pstore::address,_unsigned_long>,_std::allocator<std::pair<const_pstore::address,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<pstore::address>,_std::hash<pstore::address>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node
                     ((_Hashtable<pstore::address,_std::pair<const_pstore::address,_unsigned_long>,_std::allocator<std::pair<const_pstore::address,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<pstore::address>,_std::hash<pstore::address>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)this,addr.a_ % (this->strings_)._M_h._M_bucket_count,&local_18,addr.a_);
  if ((p_Var2 != (__node_base_ptr)0x0) && (p_Var2->_M_nxt != (_Hash_node_base *)0x0)) {
    assert_failed("strings_.find (addr) == strings_.end ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/exchange/export_strings.cpp"
                  ,0x20);
  }
  mVar1 = (this->strings_)._M_h._M_element_count;
  pmVar3 = std::__detail::
           _Map_base<pstore::address,_std::pair<const_pstore::address,_unsigned_long>,_std::allocator<std::pair<const_pstore::address,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<pstore::address>,_std::hash<pstore::address>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<pstore::address,_std::pair<const_pstore::address,_unsigned_long>,_std::allocator<std::pair<const_pstore::address,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<pstore::address>,_std::hash<pstore::address>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this,&local_18);
  *pmVar3 = mVar1;
  return mVar1;
}

Assistant:

std::uint64_t string_mapping::add (address const addr) {
                PSTORE_ASSERT (strings_.find (addr) == strings_.end ());
                PSTORE_ASSERT (strings_.size () <= std::numeric_limits<std::uint64_t>::max ());
                auto const index = static_cast<std::uint64_t> (strings_.size ());
                strings_[addr] = index;
                return index;
            }